

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O2

void __thiscall
amrex::FabArray<amrex::IArrayBox>::AllocFabs
          (FabArray<amrex::IArrayBox> *this,FabFactory<amrex::IArrayBox> *factory,Arena *ar,
          Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tags)

{
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  uint K;
  IArrayBox *pIVar1;
  pointer pbVar2;
  string *psVar3;
  undefined4 uVar4;
  value_type *pvVar5;
  int iVar6;
  ulong uVar7;
  undefined4 extraout_var;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_2;
  ulong uVar9;
  string *tag;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  value_type *__x;
  pointer __x_00;
  long nbytes;
  IArrayBox *local_68;
  undefined1 local_60;
  undefined1 local_5f;
  Arena *local_58;
  Box local_4c;
  
  uVar4 = ParallelDescriptor::m_Team._4_4_;
  uVar7 = (ulong)((long)(this->super_FabArrayBase).indexArray.
                        super_vector<int,_std::allocator<int>_>.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->super_FabArrayBase).indexArray.super_vector<int,_std::allocator<int>_>
                       .super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  (this->shmem).alloc = 1 < (int)ParallelDescriptor::m_Team._4_4_;
  local_60 = (int)uVar4 < 2;
  local_5f = 1 < (int)uVar4;
  iVar6 = (int)uVar7;
  local_58 = ar;
  std::vector<amrex::IArrayBox_*,_std::allocator<amrex::IArrayBox_*>_>::reserve
            (&this->m_fabs_v,(long)iVar6);
  uVar7 = uVar7 & 0xffffffff;
  if (iVar6 < 1) {
    uVar7 = 0;
  }
  nbytes = 0;
  for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
    K = (this->super_FabArrayBase).indexArray.super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [uVar9];
    FabArrayBase::fabbox(&local_4c,&this->super_FabArrayBase,K);
    iVar6 = (*factory->_vptr_FabFactory[2])
                      (factory,&local_4c,(ulong)(uint)(this->super_FabArrayBase).n_comp,&local_60,
                       (ulong)K);
    local_68 = (IArrayBox *)CONCAT44(extraout_var,iVar6);
    std::vector<amrex::IArrayBox*,std::allocator<amrex::IArrayBox*>>::
    emplace_back<amrex::IArrayBox*>
              ((vector<amrex::IArrayBox*,std::allocator<amrex::IArrayBox*>> *)&this->m_fabs_v,
               &local_68);
    pIVar1 = (this->m_fabs_v).
             super__Vector_base<amrex::IArrayBox_*,_std::allocator<amrex::IArrayBox_*>_>._M_impl.
             super__Vector_impl_data._M_finish[-1];
    lVar8 = (pIVar1->super_BaseFab<int>).truesize << 2;
    if ((pIVar1->super_BaseFab<int>).ptr_owner == false) {
      lVar8 = 0;
    }
    nbytes = nbytes + lVar8;
  }
  this_00 = &this->m_tags;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this_00->
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         );
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[4]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (char (*) [4])"All");
  pvVar5 = DAT_006e10c0;
  for (__x = FabArrayBase::m_region_tag_abi_cxx11_; __x != pvVar5; __x = __x + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this_00->
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ,__x);
  }
  pbVar2 = (tags->
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__x_00 = (tags->
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; __x_00 != pbVar2; __x_00 = __x_00 + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this_00->
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ,__x_00);
  }
  psVar3 = (this->m_tags).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (tag = (this->m_tags).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; tag != psVar3; tag = tag + 1) {
    FabArrayBase::updateMemUsage(tag,nbytes,ar);
  }
  return;
}

Assistant:

void
FabArray<FAB>::AllocFabs (const FabFactory<FAB>& factory, Arena* ar,
                          const Vector<std::string>& tags)
{
    const int n = indexArray.size();
    const int nworkers = ParallelDescriptor::TeamSize();
    shmem.alloc = (nworkers > 1);

    bool alloc = !shmem.alloc;

    FabInfo fab_info;
    fab_info.SetAlloc(alloc).SetShared(shmem.alloc).SetArena(ar);

    m_fabs_v.reserve(n);

    Long nbytes = 0L;
    for (int i = 0; i < n; ++i)
    {
        int K = indexArray[i];
        const Box& tmpbox = fabbox(K);
        m_fabs_v.push_back(factory.create(tmpbox, n_comp, fab_info, K));
        nbytes += amrex::nBytesOwned(*m_fabs_v.back());
    }

    m_tags.clear();
    m_tags.emplace_back("All");
    for (auto const& t : m_region_tag) {
        m_tags.push_back(t);
    }
    for (auto const& t : tags) {
        m_tags.push_back(t);
    }
    for (auto const& t: m_tags) {
        updateMemUsage(t, nbytes, ar);
    }

#ifdef BL_USE_TEAM
    if (shmem.alloc)
    {
        const int teamlead = ParallelDescriptor::MyTeamLead();

        shmem.n_values = 0;
        shmem.n_points = 0;
        Vector<Long> offset(n,0);
        Vector<Long> nextoffset(nworkers,-1);
        for (int i = 0; i < n; ++i) {
            int K = indexArray[i];
            int owner = distributionMap[K] - teamlead;
            Long s = m_fabs_v[i]->size();
            if (ownership[i]) {
                shmem.n_values += s;
                shmem.n_points += m_fabs_v[i]->numPts();
            }
            if (nextoffset[owner] < 0) {
                offset[i] = 0;
                nextoffset[owner] = s;
            } else {
                offset[i] = nextoffset[owner];
                nextoffset[owner] += s;
            }
        }

        size_t bytes = shmem.n_values*sizeof(value_type);

        value_type *mfp;
        Vector<value_type*> dps;

#if defined (BL_USE_MPI3)

        static MPI_Info info = MPI_INFO_NULL;
        if (info == MPI_INFO_NULL) {
            MPI_Info_create(&info);
            MPI_Info_set(info, "alloc_shared_noncontig", "true");
        }

        const MPI_Comm& team_comm = ParallelDescriptor::MyTeam().get();

        BL_MPI_REQUIRE( MPI_Win_allocate_shared(bytes, sizeof(value_type),
                                                info, team_comm, &mfp, &shmem.win) );

        for (int w = 0; w < nworkers; ++w) {
            MPI_Aint sz;
            int disp;
            value_type *dptr = 0;
            BL_MPI_REQUIRE( MPI_Win_shared_query(shmem.win, w, &sz, &disp, &dptr) );
            // BL_ASSERT(disp == sizeof(value_type));
            dps.push_back(dptr);
        }

#else

        amrex::Abort("BaseFab::define: to allocate shared memory, USE_MPI3 must be true");

#endif

        for (int i = 0; i < n; ++i) {
            int K = indexArray[i];
            int owner = distributionMap[K] - teamlead;
            value_type *p = dps[owner] + offset[i];
            m_fabs_v[i]->setPtr(p, m_fabs_v[i]->size());
        }

        for (Long i = 0; i < shmem.n_values; i++, mfp++) {
            new (mfp) value_type;
        }

        amrex::update_fab_stats(shmem.n_points, shmem.n_values, sizeof(value_type));
    }
#endif
}